

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_3::writeVariableReadAccumulateExpression
               (ostringstream *buf,string *accumulatorName,string *name,ShaderType shaderType,
               Storage storage,Program *program,VarType *varType)

{
  uint uVar1;
  Type TVar2;
  DataType DVar3;
  deUint32 dVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string *local_c8;
  Program *local_c0;
  ostringstream *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TVar2 = varType->m_type;
  local_d0 = name;
  local_c8 = accumulatorName;
  local_c0 = program;
  if (TVar2 != TYPE_BASIC) {
    if (TVar2 == TYPE_ARRAY) {
      iVar9 = (varType->m_data).array.size;
      if (iVar9 == -1) {
        if (storage == STORAGE_BUFFER) {
          std::operator+(&local_b0,name,"[8]");
          writeVariableReadAccumulateExpression
                    (buf,local_c8,&local_b0,shaderType,STORAGE_BUFFER,local_c0,
                     (varType->m_data).array.elementType);
        }
        else {
          if (shaderType == SHADERTYPE_TESSELLATION_EVALUATION) {
            iVar9 = 0;
            while (local_d4 = iVar9,
                  dVar4 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                    (local_c0), iVar9 < (int)dVar4) {
              std::operator+(&local_50,local_d0,"[");
              de::toString<int>(&local_70,&local_d4);
              std::operator+(&local_90,&local_50,&local_70);
              std::operator+(&local_b0,&local_90,"]");
              writeVariableReadAccumulateExpression
                        (buf,local_c8,&local_b0,SHADERTYPE_TESSELLATION_EVALUATION,storage,local_c0,
                         (varType->m_data).array.elementType);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_50);
              iVar9 = local_d4 + 1;
            }
            return;
          }
          if (shaderType == SHADERTYPE_TESSELLATION_CONTROL) {
            std::operator+(&local_b0,name,"[gl_InvocationID]");
            writeVariableReadAccumulateExpression
                      (buf,local_c8,&local_b0,SHADERTYPE_TESSELLATION_CONTROL,storage,local_c0,
                       (varType->m_data).array.elementType);
          }
          else {
            if (shaderType != SHADERTYPE_GEOMETRY) {
              return;
            }
            std::operator+(&local_b0,name,"[0]");
            writeVariableReadAccumulateExpression
                      (buf,local_c8,&local_b0,SHADERTYPE_GEOMETRY,storage,local_c0,
                       (varType->m_data).array.elementType);
          }
        }
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        local_b8 = buf;
        for (local_d4 = 0; local_d4 < iVar9; local_d4 = local_d4 + 1) {
          std::operator+(&local_50,local_d0,"[");
          de::toString<int>(&local_70,&local_d4);
          std::operator+(&local_90,&local_50,&local_70);
          std::operator+(&local_b0,&local_90,"]");
          writeVariableReadAccumulateExpression
                    (local_b8,local_c8,&local_b0,shaderType,storage,local_c0,
                     (varType->m_data).array.elementType);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          iVar9 = (varType->m_data).array.size;
        }
      }
    }
    else {
      local_b8 = (ostringstream *)CONCAT44(local_b8._4_4_,shaderType);
      if (TVar2 == TYPE_STRUCT) {
        lVar10 = 0x20;
        for (lVar6 = 0;
            lVar6 < (int)(((long)(((varType->m_data).structPtr)->m_members).
                                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(((varType->m_data).structPtr)->m_members).
                                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x38);
            lVar6 = lVar6 + 1) {
          std::operator+(&local_90,local_d0,".");
          std::operator+(&local_b0,&local_90,
                         *(char **)((long)(((varType->m_data).structPtr)->m_members).
                                          super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x20
                                   ));
          writeVariableReadAccumulateExpression
                    (buf,local_c8,&local_b0,(ShaderType)local_b8,storage,local_c0,
                     (VarType *)
                     ((long)&(((((varType->m_data).structPtr)->m_members).
                               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus._M_p
                     + lVar10));
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_90);
          lVar10 = lVar10 + 0x38;
        }
      }
    }
    return;
  }
  poVar5 = std::operator<<(&buf->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  std::operator<<(poVar5," += ");
  DVar3 = (varType->m_data).basic.type;
  uVar1 = DVar3 - TYPE_FLOAT;
  if ((uVar1 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    pcVar8 = &DAT_018e0ca4 + *(int *)(&DAT_018e0ca4 + (ulong)uVar1 * 4);
    pcVar7 = &DAT_018e0d30 + *(int *)(&DAT_018e0d30 + (ulong)uVar1 * 4);
  }
  else if (DVar3 - TYPE_BOOL_VEC2 < 3) {
    pcVar7 = ".xyxy)";
    pcVar8 = "vec4(";
  }
  else if (DVar3 - TYPE_DOUBLE_MAT2 < 9 || DVar3 - TYPE_FLOAT_MAT2 < 9) {
    pcVar7 = "[0][0]))";
    pcVar8 = "vec4(float(";
  }
  else {
    pcVar7 = ").x))";
    pcVar8 = "vec4(float(textureSize(";
    if (2 < DVar3 - TYPE_SAMPLER_2D_MULTISAMPLE) {
      if (DVar3 - TYPE_SAMPLER_1D < 0x1e) {
        pcVar7 = ", 0).x))";
      }
      else if (DVar3 - TYPE_IMAGE_2D < 0xe) {
        pcVar8 = "vec4(float(imageSize(";
      }
      else {
        if (DVar3 != TYPE_UINT_ATOMIC_COUNTER) goto LAB_013c9933;
        pcVar7 = ")))";
        pcVar8 = "vec4(float(atomicCounterIncrement(";
      }
    }
  }
  poVar5 = std::operator<<(&buf->super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
  poVar5 = std::operator<<(poVar5,(string *)local_d0);
  std::operator<<(poVar5,pcVar7);
LAB_013c9933:
  std::operator<<(&buf->super_basic_ostream<char,_std::char_traits<char>_>,";\n");
  return;
}

Assistant:

static void writeVariableReadAccumulateExpression (std::ostringstream&							buf,
												   const std::string&							accumulatorName,
												   const std::string&							name,
												   glu::ShaderType								shaderType,
												   glu::Storage									storage,
												   const ProgramInterfaceDefinition::Program*	program,
												   const glu::VarType&							varType)
{
	if (varType.isBasicType())
	{
		buf << "\t" << accumulatorName << " += ";

		if (glu::isDataTypeScalar(varType.getBasicType()))
			buf << "vec4(float(" << name << "))";
		else if (glu::isDataTypeVector(varType.getBasicType()))
			buf << "vec4(" << name << ".xyxy)";
		else if (glu::isDataTypeMatrix(varType.getBasicType()))
			buf << "vec4(float(" << name << "[0][0]))";
		else if (glu::isDataTypeSamplerMultisample(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ").x))";
		else if (glu::isDataTypeSampler(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ", 0).x))";
		else if (glu::isDataTypeImage(varType.getBasicType()))
			buf << "vec4(float(imageSize(" << name << ").x))";
		else if (varType.getBasicType() == glu::TYPE_UINT_ATOMIC_COUNTER)
			buf << "vec4(float(atomicCounterIncrement(" << name << ")))";
		else
			DE_ASSERT(false);

		buf << ";\n";
	}
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "." + varType.getStructPtr()->getMember(ndx).getName(),
												  shaderType,
												  storage,
												  program,
												  varType.getStructPtr()->getMember(ndx).getType());
	}
	else if (varType.isArrayType())
	{
		if (varType.getArraySize() != glu::VarType::UNSIZED_ARRAY)
		{
			for (int ndx = 0; ndx < varType.getArraySize(); ++ndx)
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[" + de::toString(ndx) + "]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
		}
		else if (storage == glu::STORAGE_BUFFER)
		{
			// run-time sized array, read arbitrary
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "[8]",
												  shaderType,
												  storage,
												  program,
												  varType.getElementType());
		}
		else
		{
			DE_ASSERT(storage == glu::STORAGE_IN);

			if (shaderType == glu::SHADERTYPE_GEOMETRY)
			{
				// implicit sized geometry input array, size = primitive size. Just reading first is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[0]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
			{
				// implicit sized tessellation input array, size = input patch max size. Just reading current is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[gl_InvocationID]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
			{
				// implicit sized tessellation input array, size = output patch max size. Read all to prevent optimizations
				DE_ASSERT(program->getTessellationNumOutputPatchVertices() > 0);
				for (int ndx = 0; ndx < (int)program->getTessellationNumOutputPatchVertices(); ++ndx)
				{
					writeVariableReadAccumulateExpression(buf,
														  accumulatorName,
														  name + "[" + de::toString(ndx) + "]",
														  shaderType,
														  storage,
														  program,
														  varType.getElementType());
				}
			}
			else
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);
}